

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

string * __thiscall
spoa::Graph::GenerateConsensus_abi_cxx11_
          (string *__return_storage_ptr__,Graph *this,int32_t min_coverage,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *summary)

{
  Node *pNVar1;
  bool bVar2;
  uint32_t uVar3;
  invalid_argument *this_00;
  reference pvVar4;
  reference ppNVar5;
  Node **jt;
  iterator __end3;
  iterator __begin3;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range3;
  reference local_58;
  Node **it;
  iterator __end1;
  iterator __begin1;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *summary_local;
  int32_t min_coverage_local;
  Graph *this_local;
  string *dst;
  
  if (summary == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(summary);
  GenerateConsensus_abi_cxx11_(__return_storage_ptr__,this,min_coverage);
  __end1 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                     (&this->consensus_);
  it = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end
                          (&this->consensus_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                     *)&it), bVar2) {
    local_58 = __gnu_cxx::
               __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
               ::operator*(&__end1);
    uVar3 = Node::Coverage(*local_58);
    if (min_coverage <= (int)uVar3) {
      __range3._4_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                (summary,(int *)((long)&__range3 + 4));
      uVar3 = Node::Coverage(*local_58);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(summary);
      *pvVar4 = uVar3 + *pvVar4;
      pNVar1 = *local_58;
      __end3 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                         (&pNVar1->aligned_nodes);
      jt = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end
                              (&pNVar1->aligned_nodes);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                         *)&jt), bVar2) {
        ppNVar5 = __gnu_cxx::
                  __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                  ::operator*(&__end3);
        uVar3 = Node::Coverage(*ppNVar5);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(summary);
        *pvVar4 = uVar3 + *pvVar4;
        __gnu_cxx::
        __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
        ::operator++(&__end3);
      }
    }
    __gnu_cxx::
    __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Graph::GenerateConsensus(std::int32_t min_coverage,
                                     std::vector<std::uint32_t> *summary) {
  if (!summary) {
    throw std::invalid_argument(
        "[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
  }
  summary->clear();

  auto dst = GenerateConsensus(min_coverage);
  for (const auto &it : consensus_) {
    if (static_cast<std::int32_t>(it->Coverage()) >= min_coverage) {
      summary->emplace_back(0);
      summary->back() += it->Coverage();
      for (const auto &jt : it->aligned_nodes) {
        summary->back() += jt->Coverage();
      }
    }
  }

  return dst;
}